

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

int stless_(double *y,int *n,int *len,int *ideg,int *njump,int *userw,double *rw,double *ys,
           double *res)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  uint uVar15;
  double local_68;
  double d__1;
  long local_58;
  double *local_50;
  uint *local_48;
  int local_3c;
  int local_38;
  int ok;
  int nleft;
  int nright;
  
  if (*n < 2) {
    *ys = *y;
    return 0;
  }
  local_50 = y;
  d__1._0_4_ = imin(*njump,*n + -1);
  uVar15 = *len;
  uVar9 = *n;
  lVar7 = (long)(int)uVar9;
  local_48 = (uint *)n;
  if ((int)uVar15 < (int)uVar9) {
    if (d__1._0_4_ == 1) {
      local_38 = 1;
      if ((int)uVar9 < 1) {
        return 0;
      }
      iVar6 = uVar15 - ((int)(uVar15 + 1) >> 0x1f);
      local_58 = CONCAT44(local_58._4_4_,1);
      lVar7 = 1;
      ok = uVar15;
      do {
        if ((iVar6 + 1 >> 1 < lVar7) && (uVar15 != *local_48)) {
          local_38 = (int)local_58 + 1;
          local_58 = CONCAT44(local_58._4_4_,local_38);
          uVar15 = uVar15 + 1;
          ok = uVar15;
        }
        local_68 = (double)(int)lVar7;
        stlest_(local_50,(int *)local_48,len,ideg,&local_68,ys + lVar7 + -1,&local_38,&ok,res,userw,
                rw,&local_3c);
        if (local_3c == 0) {
          ys[lVar7 + -1] = local_50[lVar7 + -1];
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != (ulong)uVar9 + 1);
    }
    else {
      bVar4 = 0 < (int)uVar9;
      if (d__1._0_4_ < 0) {
        bVar4 = (int)uVar9 < 2;
      }
      if (!bVar4) goto LAB_001517fc;
      iVar6 = (int)((uVar15 - ((int)(uVar15 + 1) >> 0x1f)) + 1) >> 1;
      local_58 = (long)d__1._0_4_;
      lVar8 = 1;
      do {
        if (lVar8 < iVar6) {
          local_38 = 1;
          ok = *len;
        }
        else {
          ok = *local_48;
          if (ok - iVar6 < lVar8) {
            local_38 = (ok - *len) + 1;
          }
          else {
            iVar11 = (int)lVar8 - iVar6;
            local_38 = iVar11 + 1;
            ok = iVar11 + *len;
          }
        }
        local_68 = (double)(int)lVar8;
        stlest_(local_50,(int *)local_48,len,ideg,&local_68,ys + lVar8 + -1,&local_38,&ok,res,userw,
                rw,&local_3c);
        if (local_3c == 0) {
          ys[lVar8 + -1] = local_50[lVar8 + -1];
        }
        lVar8 = lVar8 + local_58;
        bVar4 = lVar8 <= lVar7;
        if (d__1._0_4_ < 0) {
          bVar4 = lVar7 <= lVar8;
        }
      } while (bVar4);
    }
  }
  else {
    local_38 = 1;
    bVar4 = 0 < (int)uVar9;
    if (d__1._0_4_ < 0) {
      bVar4 = (int)uVar9 < 2;
    }
    ok = uVar9;
    if (bVar4) {
      lVar8 = (long)d__1._0_4_;
      local_58 = lVar8 * 8;
      iVar6 = 1;
      lVar12 = 0;
      pdVar14 = ys;
      do {
        local_68 = (double)iVar6;
        stlest_(local_50,(int *)local_48,len,ideg,&local_68,pdVar14,&local_38,&ok,res,userw,rw,
                &local_3c);
        if (local_3c == 0) {
          *pdVar14 = local_50[lVar12];
        }
        lVar13 = lVar8 + 1 + lVar12;
        bVar4 = lVar13 <= lVar7;
        if (d__1._0_4_ < 0) {
          bVar4 = lVar7 <= lVar13;
        }
        iVar6 = iVar6 + d__1._0_4_;
        pdVar14 = (double *)((long)pdVar14 + local_58);
        lVar12 = lVar12 + lVar8;
      } while (bVar4);
    }
  }
  if (d__1._0_4_ == 1) {
    return 0;
  }
LAB_001517fc:
  puVar5 = local_48;
  uVar15 = *local_48;
  iVar6 = uVar15 - d__1._0_4_;
  bVar4 = 0 < iVar6;
  if (d__1._0_4_ < 0) {
    bVar4 = iVar6 < 2;
  }
  if (bVar4) {
    lVar8 = (long)d__1._0_4_;
    lVar7 = 1;
    pdVar14 = ys;
    do {
      lVar12 = lVar7 + lVar8;
      if (lVar7 < lVar7 + lVar8 + -1) {
        dVar1 = ys[lVar12 + -1];
        dVar2 = ys[lVar7 + -1];
        lVar13 = 1;
        do {
          pdVar14[lVar13] =
               (double)(int)lVar13 * ((dVar1 - dVar2) / (double)d__1._0_4_) + ys[lVar7 + -1];
          lVar13 = lVar13 + 1;
        } while (d__1._0_4_ != (int)lVar13);
      }
      bVar4 = lVar12 <= iVar6;
      if (d__1._0_4_ < 0) {
        bVar4 = iVar6 <= lVar12;
      }
      pdVar14 = pdVar14 + lVar8;
      lVar7 = lVar12;
    } while (bVar4);
  }
  iVar6 = (int)(uVar15 - 1) % d__1._0_4_;
  uVar9 = (uVar15 - 1) - iVar6;
  d__1 = (double)(ulong)uVar9;
  uVar9 = uVar9 + 1;
  if (uVar9 != uVar15) {
    local_68 = (double)(int)uVar15;
    stlest_(local_50,(int *)local_48,len,ideg,&local_68,ys + (long)(int)uVar15 + -1,&local_38,&ok,
            res,userw,rw,&local_3c);
    uVar3 = *puVar5;
    if (local_3c == 0) {
      ys[(long)(int)uVar3 + -1] = local_50[(long)(int)uVar3 + -1];
    }
    if ((SUB84(d__1,0) != uVar3 - 2) && (iVar11 = SUB84(d__1,0) + 2, iVar11 < (int)uVar3)) {
      dVar1 = ys[(long)(int)uVar3 + -1];
      dVar2 = ys[(long)(int)uVar9 + -1];
      lVar7 = 0;
      do {
        iVar10 = (int)(lVar7 + 1);
        ys[(long)iVar11 + lVar7 + -1] =
             (double)iVar10 * ((dVar1 - dVar2) / (double)(int)(uVar3 - uVar9)) +
             ys[(long)(int)uVar9 + -1];
        lVar7 = lVar7 + 1;
      } while (~uVar15 + iVar6 + uVar3 != iVar10);
    }
  }
  return 0;
}

Assistant:

int stless_(double *y, int *n, int *len, int *ideg, int *njump, int *userw, double *rw, double *ys,
	 double *res)
{
    /* System generated locals */
    int i__1, i__2, i__3;
    double d__1;

    /* Local variables */
    int i__, j, k;
    int ok;
    int nsh;
    double delta;
    int nleft, newnj, nright;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --res;
    --ys;
    --rw;
    --y;

    /* Function Body */
    if (*n < 2) {
	ys[1] = y[1];
	return 0;
    }
/* Computing MIN */
    i__1 = *njump, i__2 = *n - 1;
    newnj = imin(i__1,i__2);
    if (*len >= *n) {
	nleft = 1;
	nright = *n;
	i__1 = *n;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    d__1 = (double) i__;
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[i__] = y[i__];
	    }
/* L20: */
	}
    } else {
	if (newnj == 1) {
	    nsh = (*len + 1) / 2;
	    nleft = 1;
	    nright = *len;
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		if (i__ > nsh && nright != *n) {
		    ++nleft;
		    ++nright;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L30: */
	    }
	} else {
	    nsh = (*len + 1) / 2;
	    i__2 = *n;
	    i__1 = newnj;
	    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
		if (i__ < nsh) {
		    nleft = 1;
		    nright = *len;
		} else if (i__ >= *n - nsh + 1) {
		    nleft = *n - *len + 1;
		    nright = *n;
		} else {
		    nleft = i__ - nsh + 1;
		    nright = *len + i__ - nsh;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L40: */
	    }
	}
    }
    if (newnj != 1) {
	i__1 = *n - newnj;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    delta = (ys[i__ + newnj] - ys[i__]) / (double) newnj;
	    i__3 = i__ + newnj - 1;
	    for (j = i__ + 1; j <= i__3; ++j) {
		ys[j] = ys[i__] + delta * (double) (j - i__);
/* L47: */
	    }
/* L45: */
	}
	k = (*n - 1) / newnj * newnj + 1;
	if (k != *n) {
	    d__1 = (double) (*n);
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[*n], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[*n] = y[*n];
	    }
	    if (k != *n - 1) {
		delta = (ys[*n] - ys[k]) / (double) (*n - k);
		i__2 = *n - 1;
		for (j = k + 1; j <= i__2; ++j) {
		    ys[j] = ys[k] + delta * (double) (j - k);
/* L55: */
		}
	    }
	}
    }
	return 0;
}